

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int move_event_to_in_progress_list(MESSENGER_SEND_EVENT_TASK *task)

{
  LIST_ITEM_HANDLE pLVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  int result;
  MESSENGER_SEND_EVENT_TASK *task_local;
  
  pLVar1 = singlylinkedlist_add(task->messenger->in_progress_list,task);
  if (pLVar1 == (LIST_ITEM_HANDLE)0x0) {
    l._4_4_ = 0x2ec;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"move_event_to_in_progress_list",0x2ed,1,
                "Failed moving event to in_progress list (singlylinkedlist_add failed)");
    }
  }
  else {
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

static int move_event_to_in_progress_list(MESSENGER_SEND_EVENT_TASK* task)
{
    int result;

    if (singlylinkedlist_add(task->messenger->in_progress_list, (void*)task) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed moving event to in_progress list (singlylinkedlist_add failed)");
    }
    else
    {
        result = RESULT_OK;
    }

    return result;
}